

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

object * find(void)

{
  object *poVar1;
  object *poVar2;
  int iVar3;
  object *poVar4;
  object *poVar5;
  object *poVar6;
  bool bVar7;
  
  poVar6 = topScope;
  stringCopy(idName,guard->name);
  poVar2 = universe;
  poVar1 = guard;
  bVar7 = true;
  poVar5 = (object *)0x0;
  while( true ) {
    poVar4 = poVar6;
    if (!bVar7) {
      return poVar5;
    }
    do {
      poVar4 = poVar4->next;
      iVar3 = stringCompare(poVar4->name,idName);
    } while (iVar3 != 0);
    if ((poVar4 == poVar1) && (poVar6 == poVar2)) break;
    bVar7 = poVar4 == poVar1;
    if (!bVar7) {
      poVar5 = poVar4;
    }
    poVar6 = poVar6->dsc;
  }
  mark("undef");
  exit(-1);
}

Assistant:

object * find (void) {
	variable bool cond;
	variable int ret;
	variable struct object *s; variable struct object *x; variable struct object *obj;
	s = NULL; x = NULL;	obj = NULL; ret = -1; cond = true;
	s = topScope;

	/* copy idname to guard */
	stringCopy(idName,guard->name); 
	while (cond == true){ 
		x = s->next; 
		ret = stringCompare(x->name,idName);	
		while (ret != 0) { /* iterate over objects in currentLevel, while names are different */
			x = x->next; 
			ret = stringCompare(x->name,idName);
		}

		/* did we find the guard */
		if (x != guard) { 
			obj = x;
			cond = false;
		}
		
		/* if we reach the universe and nothing was found --> error */
		if ((s == universe) && (cond == true)) { 
			obj = x;
			mark("undef");
			exit(-1);
		}
		s = s->dsc; /* step up one level */
	}
	return obj;
}